

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# botl.c
# Opt level: O3

void max_rank_sz(void)

{
  char *__s;
  size_t sVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  iVar2 = 0;
  lVar4 = 0x18;
  do {
    iVar3 = iVar2;
    if (*(char **)(&post_attribs + lVar4) != (char *)0x0) {
      sVar1 = strlen(*(char **)(&post_attribs + lVar4));
      iVar3 = (int)sVar1;
      if ((int)sVar1 < iVar2) {
        iVar3 = iVar2;
      }
    }
    __s = *(char **)((long)&(((Role *)(urole.rank + -1))->name).m + lVar4);
    iVar2 = iVar3;
    if (__s != (char *)0x0) {
      sVar1 = strlen(__s);
      iVar2 = (int)sVar1;
      if ((int)sVar1 < iVar3) {
        iVar2 = iVar3;
      }
    }
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0xa8);
  mrank_sz = iVar2;
  return;
}

Assistant:

void max_rank_sz(void)
{
	int i, r, maxr = 0;
	for (i = 0; i < 9; i++) {
	    if (urole.rank[i].m && (r = strlen(urole.rank[i].m)) > maxr) maxr = r;
	    if (urole.rank[i].f && (r = strlen(urole.rank[i].f)) > maxr) maxr = r;
	}
	mrank_sz = maxr;
	return;
}